

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_Qn_vector
          (singleParticleSpectra *this,int event_id,double pT_min_selected,double pT_max_selected,
          vector<double,_std::allocator<double>_> *event_pT_mean,
          vector<double,_std::allocator<double>_> *event_pT_mean_err,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iorder_1;
  ulong uVar16;
  int iorder;
  long lVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  pdVar1 = (event_pT_mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar12 = (ulong)(uint)this->npT;
  if (this->npT < 1) {
    uVar12 = uVar14;
  }
  pdVar2 = (event_pT_mean_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar12 != uVar14; uVar14 = uVar14 + 1) {
    pdVar1[uVar14] = 0.0;
    pdVar2[uVar14] = 0.0;
  }
  pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = 0;
  uVar14 = (ulong)(uint)this->order_max;
  if (this->order_max < 1) {
    uVar14 = uVar16;
  }
  for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    pdVar1[uVar16] = 0.0;
    pdVar2[uVar16] = 0.0;
    pdVar3[uVar16] = 0.0;
    pdVar4[uVar16] = 0.0;
    pvVar5 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (event_Qn_diff_real_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined8 *)
       (*(long *)&pvVar5[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar6[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar7[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar8[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
    }
  }
  pvVar9 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->particle_list->
           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar14 = ((long)*(pointer *)
                   ((long)&pvVar9->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                   + 8) -
           *(long *)&pvVar9->super__Vector_base<particle_info,_std::allocator<particle_info>_>) /
           0x78;
  uVar16 = 0;
  uVar12 = uVar14 & 0xffffffff;
  if ((int)uVar14 < 1) {
    uVar12 = uVar16;
  }
  for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
    lVar18 = *(long *)&(((this->particle_list).
                         super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        particle_list->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[event_id]->
                       super__Vector_base<particle_info,_std::allocator<particle_info>_>;
    lVar17 = uVar16 * 0x78;
    dVar20 = *(double *)(lVar18 + 0x28 + lVar17);
    dVar19 = *(double *)(lVar18 + 0x30 + lVar17);
    if (this->rap_type == 0) {
      dVar22 = *(double *)(lVar18 + lVar17 + 8);
      dVar19 = dVar19 * dVar19 - dVar22 * dVar22;
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
    }
    dVar20 = log((dVar20 + dVar19) / (dVar19 - dVar20));
    dVar20 = dVar20 * 0.5;
    if ((this->rap_min <= dVar20 && dVar20 != this->rap_min) && (dVar20 < this->rap_max)) {
      lVar18 = *(long *)&(((this->particle_list).
                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          particle_list->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[event_id]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar20 = *(double *)(lVar18 + 0x18 + lVar17);
      dVar19 = *(double *)(lVar18 + 0x20 + lVar17);
      dVar22 = SQRT(dVar20 * dVar20 + dVar19 * dVar19);
      dVar20 = atan2(dVar19,dVar20);
      if ((pT_min_selected < dVar22) && (dVar22 < pT_max_selected)) {
        pdVar10 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *pdVar10 = *pdVar10 + 1.0;
        pdVar10 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *pdVar10 = *pdVar10 + 1.0;
        pdVar10 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *pdVar10 = *pdVar10 + dVar22;
        pdVar10 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *pdVar10 = *pdVar10 + dVar22 * dVar22;
        for (lVar18 = 1; uVar14 = (ulong)this->order_max, lVar18 < (long)uVar14; lVar18 = lVar18 + 1
            ) {
          dVar19 = (double)(int)lVar18 * dVar20;
          dVar21 = cos(dVar19);
          dVar19 = sin(dVar19);
          pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar18] = pdVar1[lVar18] + dVar21;
          pdVar1 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar18] = pdVar1[lVar18] + dVar19;
          pdVar1 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar18] = dVar21 * dVar21 + pdVar1[lVar18];
          pdVar1 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar18] = dVar19 * dVar19 + pdVar1[lVar18];
        }
        if (((this->pT_min <= dVar22) &&
            (uVar13 = (uint)((dVar22 - this->pT_min) / this->dpT), -1 < (int)uVar13)) &&
           ((int)uVar13 < this->npT)) {
          uVar15 = (ulong)uVar13;
          pdVar1 = (event_pT_mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[uVar15] = dVar22 + pdVar1[uVar15];
          pdVar1 = (event_pT_mean_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[uVar15] = dVar22 * dVar22 + pdVar1[uVar15];
          lVar17 = 0;
          for (lVar18 = 0; lVar18 < (int)uVar14; lVar18 = lVar18 + 1) {
            dVar19 = (double)(int)lVar18 * dVar20;
            dVar22 = cos(dVar19);
            dVar19 = sin(dVar19);
            lVar11 = *(long *)((long)&(((event_Qn_diff_real->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar11 + uVar15 * 8) = *(double *)(lVar11 + uVar15 * 8) + dVar22;
            lVar11 = *(long *)((long)&(((event_Qn_diff_real_err->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar11 + uVar15 * 8) = dVar22 * dVar22 + *(double *)(lVar11 + uVar15 * 8);
            lVar11 = *(long *)((long)&(((event_Qn_diff_imag->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar11 + uVar15 * 8) = *(double *)(lVar11 + uVar15 * 8) + dVar19;
            lVar11 = *(long *)((long)&(((event_Qn_diff_imag_err->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar11 + uVar15 * 8) = dVar19 * dVar19 + *(double *)(lVar11 + uVar15 * 8);
            uVar14 = (ulong)(uint)this->order_max;
            lVar17 = lVar17 + 0x18;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector(
    int event_id, double pT_min_selected, double pT_max_selected,
    vector<double> &event_pT_mean, vector<double> &event_pT_mean_err,
    vector<double> &event_Qn_real, vector<double> &event_Qn_real_err,
    vector<double> &event_Qn_imag, vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < npT; i++) {
        event_pT_mean[i] = 0.0;
        event_pT_mean_err[i] = 0.0;
    }
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles = particle_list->get_number_of_particles(event_id);
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_particle(event_id, i).pz;
        double E_local = particle_list->get_particle(event_id, i).E;
        double mass = particle_list->get_particle(event_id, i).mass;

        double rap_local;
        if (rap_type == 0) {
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local = particle_list->get_particle(event_id, i).px;
            double py_local = particle_list->get_particle(event_id, i).py;
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            double p_phi = atan2(py_local, px_local);
            if (p_perp > pT_min_selected && p_perp < pT_max_selected) {
                event_Qn_real[0] += 1;
                event_Qn_real_err[0] += 1;
                event_Qn_imag[0] += p_perp;
                event_Qn_imag_err[0] += p_perp * p_perp;
                for (int iorder = 1; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                }

                if (p_perp < pT_min) continue;

                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;

                event_pT_mean[p_idx] += p_perp;
                event_pT_mean_err[p_idx] += p_perp * p_perp;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}